

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_cpp_wrapper_delete_all(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int key;
  uint uVar1;
  
  cpp_wrapper_setup(tc,dict,ion_fill_edge_cases);
  key = 0;
  do {
    cpp_wrapper_delete(tc,dict,key,'\0',1,'\x01');
    key = key + 1;
  } while (key != 10);
  uVar1 = 0x30;
  do {
    uVar1 = uVar1 + 2;
    cpp_wrapper_delete(tc,dict,uVar1,'\0',1,'\x01');
  } while (uVar1 < 0x62);
  uVar1 = 0x1ef;
  do {
    uVar1 = uVar1 + 5;
    cpp_wrapper_delete(tc,dict,uVar1,'\0',1,'\x01');
  } while (uVar1 < 0x3e3);
  uVar1 = 0xffffff9a;
  do {
    uVar1 = uVar1 + 2;
    cpp_wrapper_delete(tc,dict,uVar1,'\0',1,'\x01');
  } while (uVar1 < 0xffffffcc);
  return;
}

Assistant:

void
test_cpp_wrapper_delete_all(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		cpp_wrapper_delete(tc, dict, i, err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		cpp_wrapper_delete(tc, dict, i, err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		cpp_wrapper_delete(tc, dict, i, err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		cpp_wrapper_delete(tc, dict, i, err_ok, 1, boolean_true);
	}
}